

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

uint cio_read(opj_cio_t *cio,int n)

{
  byte bVar1;
  int in_ESI;
  uint v;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar2;
  undefined4 local_10;
  
  uVar2 = 0;
  for (local_10 = in_ESI + -1; -1 < local_10; local_10 = local_10 + -1) {
    bVar1 = cio_bytein((opj_cio_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    uVar2 = ((uint)bVar1 << ((byte)(local_10 << 3) & 0x1f)) + uVar2;
  }
  return uVar2;
}

Assistant:

unsigned int cio_read(opj_cio_t *cio, int n) {
	int i;
	unsigned int v;
	v = 0;
	for (i = n - 1; i >= 0; i--) {
		v += cio_bytein(cio) << (i << 3);
	}
	return v;
}